

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5CursorParseRank(Fts5Config *pConfig,Fts5Cursor *pCsr,sqlite3_value *pRank)

{
  long lVar1;
  int iVar2;
  uchar *puVar3;
  char *pcVar4;
  sqlite3_value *in_RDX;
  long *in_RSI;
  char **in_RDI;
  long in_FS_OFFSET;
  char *z;
  int rc;
  char *zRankArgs;
  char *zRank;
  uint local_34;
  long lVar5;
  long lVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_34 = 0;
  if (in_RDX == (sqlite3_value *)0x0) {
    if (in_RDI[0x1b] == (char *)0x0) {
      in_RSI[0xc] = (long)"bm25";
      in_RSI[0xd] = 0;
    }
    else {
      in_RSI[0xc] = (long)in_RDI[0x1b];
      in_RSI[0xd] = (long)in_RDI[0x1c];
    }
  }
  else {
    puVar3 = sqlite3_value_text((sqlite3_value *)0x26c52f);
    lVar6 = 0;
    lVar5 = 0;
    if (puVar3 == (uchar *)0x0) {
      iVar2 = sqlite3_value_type(in_RDX);
      local_34 = (uint)(iVar2 == 5);
    }
    else {
      local_34 = sqlite3Fts5ConfigParseRank((char *)0x0,(char **)0x0,in_RDI);
    }
    if (local_34 == 0) {
      in_RSI[0xc] = lVar6;
      in_RSI[0xd] = lVar5;
      *(uint *)(in_RSI + 10) = *(uint *)(in_RSI + 10) | 0x10;
    }
    else if (local_34 == 1) {
      pcVar4 = sqlite3_mprintf("parse error in rank function: %s",puVar3);
      *(char **)(*in_RSI + 0x10) = pcVar4;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_34;
  }
  __stack_chk_fail();
}

Assistant:

static int fts5CursorParseRank(
  Fts5Config *pConfig,
  Fts5Cursor *pCsr,
  sqlite3_value *pRank
){
  int rc = SQLITE_OK;
  if( pRank ){
    const char *z = (const char*)sqlite3_value_text(pRank);
    char *zRank = 0;
    char *zRankArgs = 0;

    if( z==0 ){
      if( sqlite3_value_type(pRank)==SQLITE_NULL ) rc = SQLITE_ERROR;
    }else{
      rc = sqlite3Fts5ConfigParseRank(z, &zRank, &zRankArgs);
    }
    if( rc==SQLITE_OK ){
      pCsr->zRank = zRank;
      pCsr->zRankArgs = zRankArgs;
      CsrFlagSet(pCsr, FTS5CSR_FREE_ZRANK);
    }else if( rc==SQLITE_ERROR ){
      pCsr->base.pVtab->zErrMsg = sqlite3_mprintf(
          "parse error in rank function: %s", z
      );
    }
  }else{
    if( pConfig->zRank ){
      pCsr->zRank = (char*)pConfig->zRank;
      pCsr->zRankArgs = (char*)pConfig->zRankArgs;
    }else{
      pCsr->zRank = (char*)FTS5_DEFAULT_RANK;
      pCsr->zRankArgs = 0;
    }
  }
  return rc;
}